

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setAutoRepeat(QAction *this,bool on)

{
  QActionPrivate *this_00;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QActionPrivate **)&this->field_0x8;
  if ((bool)(this_00->field_0x174 & 1) != on) {
    if (QCoreApplication::self != 0) {
      this_00->field_0x174 = this_00->field_0x174 & 0xfe | on;
      QActionPrivate::redoGrab(this_00,&QGuiApplicationPrivate::self->shortcutMap);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QActionPrivate::sendDataChanged(this_00);
        return;
      }
      goto LAB_004ffdb0;
    }
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning
              (local_30,"QAction: Initialize Q(Gui)Application before calling \'setAutoRepeat\'.");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_004ffdb0:
  __stack_chk_fail();
}

Assistant:

void QAction::setAutoRepeat(bool on)
{
    Q_D(QAction);
    if (d->autorepeat == on)
        return;
    QAPP_CHECK("setAutoRepeat");
    d->autorepeat = on;
    d->redoGrab(QGuiApplicationPrivate::instance()->shortcutMap);
    d->sendDataChanged();
}